

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode override_login(Curl_easy *data,connectdata *conn,char **userp,char **passwdp,
                       char **optionsp)

{
  CURL_NETRC_OPTION CVar1;
  char **ppcVar2;
  int iVar3;
  CURLUcode CVar4;
  char *pcVar5;
  CURLcode CVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char *npasswd;
  char *nuser;
  char *local_48;
  char *local_40;
  char **local_38;
  
  pcVar7 = (data->set).str[0x2c];
  bVar8 = pcVar7 != (char *)0x0;
  local_38 = passwdp;
  if (bVar8) {
    (*Curl_cfree)(*userp);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *userp = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).user_passwd = true;
  }
  ppcVar2 = local_38;
  bVar9 = (data->set).str[0x2d] != (char *)0x0;
  if (bVar9) {
    (*Curl_cfree)(*local_38);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2d]);
    *ppcVar2 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).user_passwd = true;
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(*optionsp);
    pcVar5 = (*Curl_cstrdup)((data->set).str[0x2e]);
    *optionsp = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (conn->bits).netrc = false;
  CVar1 = (data->set).use_netrc;
  if (CVar1 == CURL_NETRC_IGNORED) {
LAB_00508ecb:
    if (pcVar7 != (char *)0x0) {
LAB_00508ed4:
      CVar4 = curl_url_set((data->state).uh,CURLUPART_USER,*userp,0);
      switch(CVar4) {
      case CURLUE_OK:
        break;
      default:
        return CURLE_URL_MALFORMAT;
      case CURLUE_UNSUPPORTED_SCHEME:
        return CURLE_UNSUPPORTED_PROTOCOL;
      case CURLUE_OUT_OF_MEMORY:
        return CURLE_OUT_OF_MEMORY;
      case CURLUE_USER_NOT_ALLOWED:
        return CURLE_LOGIN_DENIED;
      }
    }
  }
  else {
    local_40 = (char *)0x0;
    local_48 = (char *)0x0;
    if (CVar1 == CURL_NETRC_OPTIONAL) {
      local_40 = *userp;
    }
    iVar3 = Curl_parsenetrc((conn->host).name,&local_40,&local_48,(data->set).str[0x14]);
    ppcVar2 = local_38;
    if (0 < iVar3) {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
      goto LAB_00508ecb;
    }
    if (iVar3 < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (conn->bits).netrc = true;
    (conn->bits).user_passwd = true;
    if ((data->set).use_netrc == CURL_NETRC_OPTIONAL) {
      if ((local_40 != (char *)0x0) && (*userp == (char *)0x0)) {
        (*Curl_cfree)((void *)0x0);
        *userp = local_40;
        bVar8 = true;
      }
      if ((local_48 != (char *)0x0) && (*ppcVar2 == (char *)0x0)) {
        pcVar7 = (char *)0x0;
        goto LAB_00508fd3;
      }
    }
    else {
      bVar10 = local_40 != (char *)0x0;
      if (bVar10) {
        (*Curl_cfree)(*userp);
        *userp = local_40;
      }
      bVar8 = bVar10 || bVar8;
      if (local_48 != (char *)0x0) {
        pcVar7 = *ppcVar2;
LAB_00508fd3:
        (*Curl_cfree)(pcVar7);
        *ppcVar2 = local_48;
        bVar9 = true;
        if (bVar8) goto LAB_00508ed4;
        goto LAB_00509000;
      }
    }
    if (bVar8) goto LAB_00508ed4;
  }
  if (!bVar9) {
    return CURLE_OK;
  }
LAB_00509000:
  CVar6 = CURLE_URL_MALFORMAT;
  CVar4 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*local_38,0);
  if (CVar4 < CURLUE_UNKNOWN_PART) {
    CVar6 = *(CURLcode *)(&DAT_00592af4 + (ulong)CVar4 * 4);
  }
  return CVar6;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn,
                               char **userp, char **passwdp, char **optionsp)
{
  bool user_changed = FALSE;
  bool passwd_changed = FALSE;
  CURLUcode uc;
  if(data->set.str[STRING_USERNAME]) {
    free(*userp);
    *userp = strdup(data->set.str[STRING_USERNAME]);
    if(!*userp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    user_changed = TRUE;
  }

  if(data->set.str[STRING_PASSWORD]) {
    free(*passwdp);
    *passwdp = strdup(data->set.str[STRING_PASSWORD]);
    if(!*passwdp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    passwd_changed = TRUE;
  }

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

  conn->bits.netrc = FALSE;
  if(data->set.use_netrc != CURL_NETRC_IGNORED) {
    char *nuser = NULL;
    char *npasswd = NULL;
    int ret;

    if(data->set.use_netrc == CURL_NETRC_OPTIONAL)
      nuser = *userp; /* to separate otherwise identical machines */

    ret = Curl_parsenetrc(conn->host.name,
                          &nuser, &npasswd,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the "
            DOT_CHAR "netrc file; using defaults\n",
            conn->host.name);
    }
    else if(ret < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
      conn->bits.user_passwd = TRUE; /* enable user+password */

      if(data->set.use_netrc == CURL_NETRC_OPTIONAL) {
        /* prefer credentials outside netrc */
        if(nuser && !*userp) {
          free(*userp);
          *userp = nuser;
          user_changed = TRUE;
        }
        if(npasswd && !*passwdp) {
          free(*passwdp);
          *passwdp = npasswd;
          passwd_changed = TRUE;
        }
      }
      else {
        /* prefer netrc credentials */
        if(nuser) {
          free(*userp);
          *userp = nuser;
          user_changed = TRUE;
        }
        if(npasswd) {
          free(*passwdp);
          *passwdp = npasswd;
          passwd_changed = TRUE;
        }
      }
    }
  }

  /* for updated strings, we update them in the URL */
  if(user_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, *userp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  if(passwd_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD, *passwdp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  return CURLE_OK;
}